

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::Thermo::getHeatFlux(Thermo *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  SnapshotManager *this_00;
  double *pdVar9;
  undefined8 *in_RSI;
  Vector3d *in_RDI;
  RealType RVar10;
  double dVar11;
  Vector3<double> *this_01;
  Vector3d heatFluxJv;
  RigidBody *rb;
  Vector3d heatFluxJc;
  RealType eatom;
  RealType potential;
  RealType kinetic;
  Vector3d x_a;
  RealType mass;
  int k;
  int j;
  int i;
  Mat3x3d I;
  Vector3d angMom;
  Vector3d vel;
  Atom *atom;
  AtomIterator ai;
  StuntDouble *sd;
  Molecule *mol;
  iterator iiter;
  MoleculeIterator miter;
  Snapshot *currSnapshot;
  Snapshot *in_stack_fffffffffffffba8;
  StuntDouble *in_stack_fffffffffffffbb0;
  Molecule *in_stack_fffffffffffffbb8;
  iterator *in_stack_fffffffffffffbc8;
  SimInfo *in_stack_fffffffffffffbd0;
  undefined1 local_1a8 [120];
  Vector<double,_3U> local_130;
  double local_118;
  double local_110;
  double local_108;
  RealType local_d8;
  uint local_cc;
  uint local_c8;
  int local_c4;
  RectMatrix<double,_3U,_3U> local_c0;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Atom *local_48;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_40;
  StuntDouble *local_38;
  Molecule *local_30;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  Snapshot *local_18;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RSI);
  local_18 = SnapshotManager::getCurrentSnapshot(this_00);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_40);
  Vector3<double>::Vector3((Vector3<double> *)0x23d3f6);
  Vector3<double>::Vector3((Vector3<double> *)0x23d403);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x23d410);
  Vector3<double>::Vector3((Vector3<double> *)0x23d41d);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffbb0,
             (Vector3<double> *)in_stack_fffffffffffffba8);
  local_30 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffbd0,(MoleculeIterator *)in_stack_fffffffffffffbc8);
  while (local_30 != (Molecule *)0x0) {
    local_38 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffffbd0,
                          (iterator *)in_stack_fffffffffffffbc8);
    while (local_38 != (StuntDouble *)0x0) {
      local_d8 = StuntDouble::getMass(local_38);
      StuntDouble::getVel((StuntDouble *)in_stack_fffffffffffffbb8);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffbb0,
                 (Vector3<double> *)in_stack_fffffffffffffba8);
      RVar10 = local_d8;
      pdVar9 = Vector<double,_3U>::operator[](&local_60,0);
      dVar1 = *pdVar9;
      pdVar9 = Vector<double,_3U>::operator[](&local_60,0);
      dVar2 = *pdVar9;
      pdVar9 = Vector<double,_3U>::operator[](&local_60,1);
      dVar11 = *pdVar9;
      pdVar9 = Vector<double,_3U>::operator[](&local_60,1);
      dVar3 = *pdVar9;
      pdVar9 = Vector<double,_3U>::operator[](&local_60,2);
      dVar4 = *pdVar9;
      pdVar9 = Vector<double,_3U>::operator[](&local_60,2);
      local_108 = RVar10 * (dVar4 * *pdVar9 + dVar1 * dVar2 + dVar11 * dVar3);
      bVar8 = StuntDouble::isDirectional(in_stack_fffffffffffffbb0);
      if (bVar8) {
        StuntDouble::getJ((StuntDouble *)in_stack_fffffffffffffbb8);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffbb0,
                   (Vector3<double> *)in_stack_fffffffffffffba8);
        (*local_38->_vptr_StuntDouble[5])(local_1a8);
        SquareMatrix3<double>::operator=
                  ((SquareMatrix3<double> *)in_stack_fffffffffffffbb0,
                   (SquareMatrix3<double> *)in_stack_fffffffffffffba8);
        SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x23d71f);
        bVar8 = StuntDouble::isLinear(local_38);
        if (bVar8) {
          local_c4 = StuntDouble::linearAxis(local_38);
          local_c8 = local_c4 + 1 + ((local_c4 + 1) / 3) * -3;
          local_cc = local_c4 + 2 + ((local_c4 + 2) / 3) * -3;
          pdVar9 = Vector<double,_3U>::operator[](&local_78,local_c8);
          dVar1 = *pdVar9;
          pdVar9 = Vector<double,_3U>::operator[](&local_78,local_c8);
          dVar2 = *pdVar9;
          pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,local_c8,local_c8);
          dVar11 = *pdVar9;
          pdVar9 = Vector<double,_3U>::operator[](&local_78,local_cc);
          dVar3 = *pdVar9;
          pdVar9 = Vector<double,_3U>::operator[](&local_78,local_cc);
          dVar4 = *pdVar9;
          pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,local_cc,local_cc);
          local_108 = (dVar1 * dVar2) / dVar11 + (dVar3 * dVar4) / *pdVar9 + local_108;
        }
        else {
          pdVar9 = Vector<double,_3U>::operator[](&local_78,0);
          dVar1 = *pdVar9;
          pdVar9 = Vector<double,_3U>::operator[](&local_78,0);
          dVar2 = *pdVar9;
          pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,0,0);
          dVar11 = *pdVar9;
          pdVar9 = Vector<double,_3U>::operator[](&local_78,1);
          dVar3 = *pdVar9;
          pdVar9 = Vector<double,_3U>::operator[](&local_78,1);
          dVar4 = *pdVar9;
          pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,1,1);
          dVar5 = *pdVar9;
          pdVar9 = Vector<double,_3U>::operator[](&local_78,2);
          dVar6 = *pdVar9;
          pdVar9 = Vector<double,_3U>::operator[](&local_78,2);
          dVar7 = *pdVar9;
          pdVar9 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,2,2);
          local_108 = (dVar1 * dVar2) / dVar11 + (dVar3 * dVar4) / dVar5 + (dVar6 * dVar7) / *pdVar9
                      + local_108;
        }
      }
      local_110 = 0.0;
      bVar8 = StuntDouble::isRigidBody(local_38);
      if (bVar8) {
        if (local_38 != (StuntDouble *)0x0) {
          __dynamic_cast(local_38,&StuntDouble::typeinfo,&RigidBody::typeinfo,0);
        }
        local_48 = RigidBody::beginAtom
                             ((RigidBody *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
        while (local_48 != (Atom *)0x0) {
          RVar10 = StuntDouble::getParticlePot(in_stack_fffffffffffffbb0);
          local_110 = RVar10 + local_110;
          local_48 = RigidBody::nextAtom((RigidBody *)in_stack_fffffffffffffbd0,
                                         in_stack_fffffffffffffbc8);
        }
      }
      else {
        local_110 = StuntDouble::getParticlePot(in_stack_fffffffffffffbb0);
      }
      local_110 = local_110 * 0.0004184;
      dVar11 = (local_108 + local_110) * 0.5;
      local_118 = dVar11;
      pdVar9 = Vector<double,_3U>::operator[](&local_60,0);
      dVar1 = *pdVar9;
      pdVar9 = Vector<double,_3U>::operator[](&local_130,0);
      dVar2 = local_118;
      *pdVar9 = dVar11 * dVar1 + *pdVar9;
      pdVar9 = Vector<double,_3U>::operator[](&local_60,1);
      dVar1 = *pdVar9;
      pdVar9 = Vector<double,_3U>::operator[](&local_130,1);
      dVar11 = local_118;
      *pdVar9 = dVar2 * dVar1 + *pdVar9;
      pdVar9 = Vector<double,_3U>::operator[](&local_60,2);
      in_stack_fffffffffffffbc8 = (iterator *)*pdVar9;
      in_stack_fffffffffffffbd0 = (SimInfo *)Vector<double,_3U>::operator[](&local_130,2);
      in_stack_fffffffffffffbd0->_vptr_SimInfo =
           (_func_int **)
           (dVar11 * (double)in_stack_fffffffffffffbc8 +
           (double)in_stack_fffffffffffffbd0->_vptr_SimInfo);
      local_38 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffbd0,
                            (iterator *)in_stack_fffffffffffffbc8);
    }
    in_stack_fffffffffffffbb8 =
         SimInfo::nextMolecule
                   (in_stack_fffffffffffffbd0,(MoleculeIterator *)in_stack_fffffffffffffbc8);
    local_30 = in_stack_fffffffffffffbb8;
  }
  Snapshot::getConductiveHeatFlux(in_stack_fffffffffffffba8);
  OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffbb8,
                    (double)in_stack_fffffffffffffbb0);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_stack_fffffffffffffbb0,
             (Vector<double,_3U> *)in_stack_fffffffffffffba8);
  OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffbb8,
                    (Vector<double,_3U> *)in_stack_fffffffffffffbb0);
  this_01 = (Vector3<double> *)getVolume((Thermo *)in_stack_fffffffffffffbb0);
  operator/((Vector<double,_3U> *)in_stack_fffffffffffffbb8,(double)this_01);
  Vector3<double>::Vector3(this_01,(Vector<double,_3U> *)in_stack_fffffffffffffba8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x23dfcf);
  return in_RDI;
}

Assistant:

Vector3d Thermo::getHeatFlux() {
    Snapshot* currSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    SimInfo::MoleculeIterator miter;
    vector<StuntDouble*>::iterator iiter;
    Molecule* mol;
    StuntDouble* sd;
    RigidBody::AtomIterator ai;
    Atom* atom;
    Vector3d vel;
    Vector3d angMom;
    Mat3x3d I;
    int i;
    int j;
    int k;
    RealType mass;

    Vector3d x_a;
    RealType kinetic;
    RealType potential;
    RealType eatom;
    // Convective portion of the heat flux
    Vector3d heatFluxJc = V3Zero;

    /* Calculate convective portion of the heat flux */
    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        mass = sd->getMass();
        vel  = sd->getVel();

        kinetic = mass * (vel[0] * vel[0] + vel[1] * vel[1] + vel[2] * vel[2]);

        if (sd->isDirectional()) {
          angMom = sd->getJ();
          I      = sd->getI();

          if (sd->isLinear()) {
            i = sd->linearAxis();
            j = (i + 1) % 3;
            k = (i + 2) % 3;
            kinetic += angMom[j] * angMom[j] / I(j, j) +
                       angMom[k] * angMom[k] / I(k, k);
          } else {
            kinetic += angMom[0] * angMom[0] / I(0, 0) +
                       angMom[1] * angMom[1] / I(1, 1) +
                       angMom[2] * angMom[2] / I(2, 2);
          }
        }

        potential = 0.0;

        if (sd->isRigidBody()) {
          RigidBody* rb = dynamic_cast<RigidBody*>(sd);
          for (atom = rb->beginAtom(ai); atom != NULL;
               atom = rb->nextAtom(ai)) {
            potential += atom->getParticlePot();
          }
        } else {
          potential = sd->getParticlePot();
        }

        potential *= Constants::energyConvert;  // amu A^2/fs^2
        // The potential may not be a 1/2 factor
        eatom = (kinetic + potential) / 2.0;  // amu A^2/fs^2
        heatFluxJc[0] += eatom * vel[0];      // amu A^3/fs^3
        heatFluxJc[1] += eatom * vel[1];      // amu A^3/fs^3
        heatFluxJc[2] += eatom * vel[2];      // amu A^3/fs^3
      }
    }

    /* The J_v vector is reduced in the forceManager so everyone has
     *  the global Jv. Jc is computed over the local atoms and must be
     *  reduced among all processors.
     */
#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &heatFluxJc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // (kcal/mol * A/fs) * conversion => (amu A^3)/fs^3

    Vector3d heatFluxJv =
        currSnapshot->getConductiveHeatFlux() * Constants::energyConvert;

    // Correct for the fact the flux is 1/V (Jc + Jv)
    return (heatFluxJv + heatFluxJc) / this->getVolume();  // amu / fs^3
  }